

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void __thiscall
duckdb::ReservoirQuantileState<short>::Resize(ReservoirQuantileState<short> *this,idx_t new_len)

{
  void *pvVar1;
  InternalException *this_00;
  ulong in_RSI;
  long *in_RDI;
  short *old_v;
  allocator local_39;
  string local_38 [32];
  void *local_18;
  ulong local_10;
  
  if ((ulong)in_RDI[1] < in_RSI) {
    local_18 = (void *)*in_RDI;
    local_10 = in_RSI;
    pvVar1 = realloc((void *)*in_RDI,in_RSI << 1);
    *in_RDI = (long)pvVar1;
    if (*in_RDI == 0) {
      free(local_18);
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Memory allocation failure",&local_39);
      duckdb::InternalException::InternalException(this_00,local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    in_RDI[1] = local_10;
  }
  return;
}

Assistant:

void Resize(idx_t new_len) {
		if (new_len <= len) {
			return;
		}
		T *old_v = v;
		v = (T *)realloc(v, new_len * sizeof(T));
		if (!v) {
			free(old_v);
			throw InternalException("Memory allocation failure");
		}
		len = new_len;
	}